

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceFieldOptions.cpp
# Opt level: O2

void __thiscall OpenMD::ForceFieldOptions::ForceFieldOptions(ForceFieldOptions *this)

{
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  ParamMap *this_01;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  allocator<char> local_139;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_118;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_f0;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_e8;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_e0;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d8;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d0;
  ParameterBase *local_c8;
  ParameterBase *local_c0;
  ParameterBase *local_b8;
  ParameterBase *local_b0;
  ParameterBase *local_a8;
  ParameterBase *local_a0;
  ParameterBase *local_98;
  ParameterBase *local_90;
  ParameterBase *local_88;
  ParameterBase *local_80;
  ParameterBase *local_78;
  ParameterBase *local_70;
  ParameterBase *local_68;
  ParameterBase *local_60;
  ParameterBase *local_58;
  ParameterBase *local_50;
  ParameterBase *local_48;
  ParameterBase *local_40;
  ParameterBase *local_38;
  
  DataHolder::DataHolder(&this->super_DataHolder);
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__ForceFieldOptions_00205228;
  local_38 = &(this->Name).super_ParameterBase;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_38);
  local_d0 = &this->vdWtype;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(local_d0);
  local_d8 = &this->DistanceMixingRule;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(local_d8);
  local_e0 = &this->DistanceType;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(local_e0);
  local_e8 = &this->EnergyMixingRule;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(local_e8);
  (this->EnergyUnitScaling).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->EnergyUnitScaling).super_ParameterBase.keyword_.field_2;
  (this->EnergyUnitScaling).super_ParameterBase.keyword_._M_string_length = 0;
  local_40 = &(this->EnergyUnitScaling).super_ParameterBase;
  (this->EnergyUnitScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->EnergyUnitScaling).super_ParameterBase.optional_ = false;
  (this->EnergyUnitScaling).super_ParameterBase.defaultValue_ = false;
  (this->EnergyUnitScaling).super_ParameterBase.empty_ = true;
  (this->EnergyUnitScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002056d0;
  (this->MetallicEnergyUnitScaling).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->MetallicEnergyUnitScaling).super_ParameterBase.keyword_.field_2;
  (this->MetallicEnergyUnitScaling).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MetallicEnergyUnitScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MetallicEnergyUnitScaling).super_ParameterBase.optional_ = false;
  (this->MetallicEnergyUnitScaling).super_ParameterBase.defaultValue_ = false;
  local_48 = &(this->MetallicEnergyUnitScaling).super_ParameterBase;
  (this->MetallicEnergyUnitScaling).super_ParameterBase.empty_ = true;
  (this->MetallicEnergyUnitScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002056d0;
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.keyword_.field_2;
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.keyword_._M_string_length = 0;
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] =
       '\0';
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.optional_ = false;
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.defaultValue_ = false;
  local_50 = &(this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase;
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.empty_ = true;
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002056d0;
  (this->DistanceUnitScaling).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->DistanceUnitScaling).super_ParameterBase.keyword_.field_2;
  (this->DistanceUnitScaling).super_ParameterBase.keyword_._M_string_length = 0;
  (this->DistanceUnitScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->DistanceUnitScaling).super_ParameterBase.optional_ = false;
  (this->DistanceUnitScaling).super_ParameterBase.defaultValue_ = false;
  local_58 = &(this->DistanceUnitScaling).super_ParameterBase;
  (this->DistanceUnitScaling).super_ParameterBase.empty_ = true;
  (this->DistanceUnitScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002056d0;
  (this->AngleUnitScaling).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->AngleUnitScaling).super_ParameterBase.keyword_.field_2;
  (this->AngleUnitScaling).super_ParameterBase.keyword_._M_string_length = 0;
  (this->AngleUnitScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->AngleUnitScaling).super_ParameterBase.optional_ = false;
  (this->AngleUnitScaling).super_ParameterBase.defaultValue_ = false;
  local_60 = &(this->AngleUnitScaling).super_ParameterBase;
  (this->AngleUnitScaling).super_ParameterBase.empty_ = true;
  (this->AngleUnitScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002056d0;
  (this->ChargeUnitScaling).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ChargeUnitScaling).super_ParameterBase.keyword_.field_2;
  (this->ChargeUnitScaling).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ChargeUnitScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ChargeUnitScaling).super_ParameterBase.optional_ = false;
  (this->ChargeUnitScaling).super_ParameterBase.defaultValue_ = false;
  local_68 = &(this->ChargeUnitScaling).super_ParameterBase;
  (this->ChargeUnitScaling).super_ParameterBase.empty_ = true;
  (this->ChargeUnitScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002056d0;
  (this->OxidationStateScaling).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->OxidationStateScaling).super_ParameterBase.keyword_.field_2;
  (this->OxidationStateScaling).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OxidationStateScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OxidationStateScaling).super_ParameterBase.optional_ = false;
  (this->OxidationStateScaling).super_ParameterBase.defaultValue_ = false;
  local_70 = &(this->OxidationStateScaling).super_ParameterBase;
  (this->OxidationStateScaling).super_ParameterBase.empty_ = true;
  (this->OxidationStateScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002056d0;
  local_f0 = &this->TorsionAngleConvention;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(local_f0);
  (this->vdw12scale).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->vdw12scale).super_ParameterBase.keyword_.field_2;
  (this->vdw12scale).super_ParameterBase.keyword_._M_string_length = 0;
  (this->vdw12scale).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->vdw12scale).super_ParameterBase.optional_ = false;
  (this->vdw12scale).super_ParameterBase.defaultValue_ = false;
  local_78 = &(this->vdw12scale).super_ParameterBase;
  (this->vdw12scale).super_ParameterBase.empty_ = true;
  (this->vdw12scale).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002056d0;
  (this->vdw13scale).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->vdw13scale).super_ParameterBase.keyword_.field_2;
  (this->vdw13scale).super_ParameterBase.keyword_._M_string_length = 0;
  (this->vdw13scale).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->vdw13scale).super_ParameterBase.optional_ = false;
  (this->vdw13scale).super_ParameterBase.defaultValue_ = false;
  local_80 = &(this->vdw13scale).super_ParameterBase;
  (this->vdw13scale).super_ParameterBase.empty_ = true;
  (this->vdw13scale).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002056d0;
  (this->vdw14scale).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->vdw14scale).super_ParameterBase.keyword_.field_2;
  (this->vdw14scale).super_ParameterBase.keyword_._M_string_length = 0;
  (this->vdw14scale).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->vdw14scale).super_ParameterBase.optional_ = false;
  (this->vdw14scale).super_ParameterBase.defaultValue_ = false;
  local_88 = &(this->vdw14scale).super_ParameterBase;
  (this->vdw14scale).super_ParameterBase.empty_ = true;
  (this->vdw14scale).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002056d0;
  (this->BondForceConstantScaling).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->BondForceConstantScaling).super_ParameterBase.keyword_.field_2;
  (this->BondForceConstantScaling).super_ParameterBase.keyword_._M_string_length = 0;
  (this->BondForceConstantScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->BondForceConstantScaling).super_ParameterBase.optional_ = false;
  (this->BondForceConstantScaling).super_ParameterBase.defaultValue_ = false;
  local_a8 = &(this->BondForceConstantScaling).super_ParameterBase;
  (this->BondForceConstantScaling).super_ParameterBase.empty_ = true;
  (this->BondForceConstantScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002056d0;
  (this->BendForceConstantScaling).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->BendForceConstantScaling).super_ParameterBase.keyword_.field_2;
  (this->BendForceConstantScaling).super_ParameterBase.keyword_._M_string_length = 0;
  (this->BendForceConstantScaling).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->BendForceConstantScaling).super_ParameterBase.optional_ = false;
  (this->BendForceConstantScaling).super_ParameterBase.defaultValue_ = false;
  local_b0 = &(this->BendForceConstantScaling).super_ParameterBase;
  (this->BendForceConstantScaling).super_ParameterBase.empty_ = true;
  (this->BendForceConstantScaling).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002056d0;
  (this->electrostatic12scale).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->electrostatic12scale).super_ParameterBase.keyword_.field_2;
  (this->electrostatic12scale).super_ParameterBase.keyword_._M_string_length = 0;
  (this->electrostatic12scale).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->electrostatic12scale).super_ParameterBase.optional_ = false;
  (this->electrostatic12scale).super_ParameterBase.defaultValue_ = false;
  local_90 = &(this->electrostatic12scale).super_ParameterBase;
  (this->electrostatic12scale).super_ParameterBase.empty_ = true;
  (this->electrostatic12scale).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002056d0;
  (this->electrostatic13scale).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->electrostatic13scale).super_ParameterBase.keyword_.field_2;
  (this->electrostatic13scale).super_ParameterBase.keyword_._M_string_length = 0;
  (this->electrostatic13scale).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->electrostatic13scale).super_ParameterBase.optional_ = false;
  (this->electrostatic13scale).super_ParameterBase.defaultValue_ = false;
  local_98 = &(this->electrostatic13scale).super_ParameterBase;
  (this->electrostatic13scale).super_ParameterBase.empty_ = true;
  (this->electrostatic13scale).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002056d0;
  (this->electrostatic14scale).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->electrostatic14scale).super_ParameterBase.keyword_.field_2;
  (this->electrostatic14scale).super_ParameterBase.keyword_._M_string_length = 0;
  (this->electrostatic14scale).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->electrostatic14scale).super_ParameterBase.optional_ = false;
  (this->electrostatic14scale).super_ParameterBase.defaultValue_ = false;
  local_a0 = &(this->electrostatic14scale).super_ParameterBase;
  (this->electrostatic14scale).super_ParameterBase.empty_ = true;
  (this->electrostatic14scale).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002056d0;
  (this->GayBerneMu).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->GayBerneMu).super_ParameterBase.keyword_.field_2;
  (this->GayBerneMu).super_ParameterBase.keyword_._M_string_length = 0;
  (this->GayBerneMu).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->GayBerneMu).super_ParameterBase.optional_ = false;
  (this->GayBerneMu).super_ParameterBase.defaultValue_ = false;
  local_b8 = &(this->GayBerneMu).super_ParameterBase;
  (this->GayBerneMu).super_ParameterBase.empty_ = true;
  (this->GayBerneMu).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002056d0;
  (this->GayBerneNu).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->GayBerneNu).super_ParameterBase.keyword_.field_2;
  (this->GayBerneNu).super_ParameterBase.keyword_._M_string_length = 0;
  (this->GayBerneNu).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->GayBerneNu).super_ParameterBase.optional_ = false;
  (this->GayBerneNu).super_ParameterBase.defaultValue_ = false;
  local_c0 = &(this->GayBerneNu).super_ParameterBase;
  (this->GayBerneNu).super_ParameterBase.empty_ = true;
  (this->GayBerneNu).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002056d0;
  this_00 = &this->EAMMixingMethod;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(this_00);
  local_c8 = &(this->DelayedParameterCalculation).super_ParameterBase;
  (this->DelayedParameterCalculation).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->DelayedParameterCalculation).super_ParameterBase.keyword_.field_2;
  (this->DelayedParameterCalculation).super_ParameterBase.keyword_._M_string_length = 0;
  (this->DelayedParameterCalculation).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->DelayedParameterCalculation).super_ParameterBase.optional_ = false;
  (this->DelayedParameterCalculation).super_ParameterBase.defaultValue_ = false;
  (this->DelayedParameterCalculation).super_ParameterBase.empty_ = true;
  (this->DelayedParameterCalculation).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00205658;
  this_01 = &this->parameters_;
  p_Var1 = &(this->parameters_)._M_t._M_impl.super__Rb_tree_header;
  (this->parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->parameters_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"Name",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign((string *)&(this->Name).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->Name).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"Name",&local_139);
  local_118.first._M_string_length = local_130;
  paVar2 = &local_118.first.field_2;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = local_38;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"vdWtype",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign((string *)&(this->vdWtype).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->vdWtype).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"Lennard-Jones",(allocator<char> *)&local_138);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue(local_d0,&local_118.first);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"vdWtype",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = &local_d0->super_ParameterBase;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"DistanceMixingRule",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign
            ((string *)&(this->DistanceMixingRule).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->DistanceMixingRule).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"arithmetic",(allocator<char> *)&local_138);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue(local_d8,&local_118.first);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"DistanceMixingRule",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = &local_d8->super_ParameterBase;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"DistanceType",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign((string *)&(this->DistanceType).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->DistanceType).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"sigma",(allocator<char> *)&local_138);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue(local_e0,&local_118.first);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"DistanceType",&local_139)
  ;
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = &local_e0->super_ParameterBase;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"EnergyMixingRule",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign((string *)&(this->EnergyMixingRule).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->EnergyMixingRule).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"geometric",(allocator<char> *)&local_138);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue(local_e8,&local_118.first);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"EnergyMixingRule",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = &local_e8->super_ParameterBase;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"EnergyUnitScaling",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign((string *)&(this->EnergyUnitScaling).super_ParameterBase.keyword_)
  ;
  std::__cxx11::string::~string((string *)&local_118);
  (this->EnergyUnitScaling).super_ParameterBase.optional_ = true;
  (this->EnergyUnitScaling).super_ParameterBase.defaultValue_ = true;
  (this->EnergyUnitScaling).data_ = 1.0;
  (this->EnergyUnitScaling).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"EnergyUnitScaling",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = local_40;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"MetallicEnergyUnitScaling",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign
            ((string *)&(this->MetallicEnergyUnitScaling).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->MetallicEnergyUnitScaling).super_ParameterBase.optional_ = true;
  (this->MetallicEnergyUnitScaling).super_ParameterBase.defaultValue_ = true;
  (this->MetallicEnergyUnitScaling).data_ = 1.0;
  (this->MetallicEnergyUnitScaling).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"MetallicEnergyUnitScaling",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = local_48;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"FluctuatingChargeEnergyUnitScaling",(allocator<char> *)&local_138
            );
  std::__cxx11::string::_M_assign
            ((string *)&(this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.optional_ = true;
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.defaultValue_ = true;
  (this->FluctuatingChargeEnergyUnitScaling).data_ = 1.0;
  (this->FluctuatingChargeEnergyUnitScaling).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"FluctuatingChargeEnergyUnitScaling",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = local_50;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"DistanceUnitScaling",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign
            ((string *)&(this->DistanceUnitScaling).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->DistanceUnitScaling).super_ParameterBase.optional_ = true;
  (this->DistanceUnitScaling).super_ParameterBase.defaultValue_ = true;
  (this->DistanceUnitScaling).data_ = 1.0;
  (this->DistanceUnitScaling).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"DistanceUnitScaling",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = local_58;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"AngleUnitScaling",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign((string *)&(this->AngleUnitScaling).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->AngleUnitScaling).super_ParameterBase.optional_ = true;
  (this->AngleUnitScaling).super_ParameterBase.defaultValue_ = true;
  (this->AngleUnitScaling).data_ = 1.0;
  (this->AngleUnitScaling).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"AngleUnitScaling",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = local_60;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"ChargeUnitScaling",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign((string *)&(this->ChargeUnitScaling).super_ParameterBase.keyword_)
  ;
  std::__cxx11::string::~string((string *)&local_118);
  (this->ChargeUnitScaling).super_ParameterBase.optional_ = true;
  (this->ChargeUnitScaling).super_ParameterBase.defaultValue_ = true;
  (this->ChargeUnitScaling).data_ = 1.0;
  (this->ChargeUnitScaling).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"ChargeUnitScaling",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = local_68;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"OxidationStateScaling",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign
            ((string *)&(this->OxidationStateScaling).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->OxidationStateScaling).super_ParameterBase.optional_ = true;
  (this->OxidationStateScaling).super_ParameterBase.defaultValue_ = true;
  (this->OxidationStateScaling).data_ = 1.0;
  (this->OxidationStateScaling).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"OxidationStateScaling",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = local_70;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"TorsionAngleConvention",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign
            ((string *)&(this->TorsionAngleConvention).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->TorsionAngleConvention).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"180_is_trans",(allocator<char> *)&local_138);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue(local_f0,&local_118.first);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"TorsionAngleConvention",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = &local_f0->super_ParameterBase;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"vdW-12-scale",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign((string *)&(this->vdw12scale).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->vdw12scale).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"vdW-12-scale",&local_139)
  ;
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = local_78;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"vdW-13-scale",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign((string *)&(this->vdw13scale).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->vdw13scale).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"vdW-13-scale",&local_139)
  ;
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = local_80;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"vdW-14-scale",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign((string *)&(this->vdw14scale).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->vdw14scale).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"vdW-14-scale",&local_139)
  ;
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = local_88;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"electrostatic-12-scale",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign
            ((string *)&(this->electrostatic12scale).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->electrostatic12scale).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"electrostatic-12-scale",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = local_90;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"electrostatic-13-scale",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign
            ((string *)&(this->electrostatic13scale).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->electrostatic13scale).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"electrostatic-13-scale",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = local_98;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"electrostatic-14-scale",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign
            ((string *)&(this->electrostatic14scale).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->electrostatic14scale).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"electrostatic-14-scale",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = local_a0;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"BondForceConstantScaling",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign
            ((string *)&(this->BondForceConstantScaling).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->BondForceConstantScaling).super_ParameterBase.optional_ = true;
  (this->BondForceConstantScaling).super_ParameterBase.defaultValue_ = true;
  (this->BondForceConstantScaling).data_ = 1.0;
  (this->BondForceConstantScaling).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"BondForceConstantScaling",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = local_a8;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"BendForceConstantScaling",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign
            ((string *)&(this->BendForceConstantScaling).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->BendForceConstantScaling).super_ParameterBase.optional_ = true;
  (this->BendForceConstantScaling).super_ParameterBase.defaultValue_ = true;
  (this->BendForceConstantScaling).data_ = 1.0;
  (this->BendForceConstantScaling).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"BendForceConstantScaling",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = local_b0;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"GayBerneMu",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign((string *)&(this->GayBerneMu).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->GayBerneMu).super_ParameterBase.optional_ = true;
  (this->GayBerneMu).super_ParameterBase.defaultValue_ = true;
  (this->GayBerneMu).data_ = 2.0;
  (this->GayBerneMu).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"GayBerneMu",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = local_b8;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"GayBerneNu",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign((string *)&(this->GayBerneNu).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->GayBerneNu).super_ParameterBase.optional_ = true;
  (this->GayBerneNu).super_ParameterBase.defaultValue_ = true;
  (this->GayBerneNu).data_ = 1.0;
  (this->GayBerneNu).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"GayBerneNu",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = local_c0;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"EAMMixingMethod",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign((string *)&(this->EAMMixingMethod).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->EAMMixingMethod).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"Johnson",(allocator<char> *)&local_138);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue(this_00,&local_118.first);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"EAMMixingMethod",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_138 = &local_128;
  local_118.second = &this_00->super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"delayedParameterCalculation",(allocator<char> *)&local_138);
  std::__cxx11::string::_M_assign
            ((string *)&(this->DelayedParameterCalculation).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_118);
  (this->DelayedParameterCalculation).super_ParameterBase.optional_ = true;
  (this->DelayedParameterCalculation).super_ParameterBase.defaultValue_ = true;
  (this->DelayedParameterCalculation).super_ParameterBase.empty_ = false;
  (this->DelayedParameterCalculation).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"delayedParameterCalculation",&local_139);
  local_118.first._M_string_length = local_130;
  if (local_138 == &local_128) {
    local_118.first.field_2._8_8_ = local_128._8_8_;
    local_118.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_118.first._M_dataplus._M_p = (pointer)local_138;
  }
  local_118.first.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
  local_118.first.field_2._M_local_buf[0] = local_128._M_local_buf[0];
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118.second = local_c8;
  local_138 = &local_128;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"cutoffPolicy",(allocator<char> *)&local_138);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&(this->super_DataHolder).deprecatedKeywords_,&local_118.first);
  std::__cxx11::string::~string((string *)&local_118);
  return;
}

Assistant:

ForceFieldOptions::ForceFieldOptions() {
    DefineOptionalParameter(Name, "Name");
    DefineOptionalParameterWithDefaultValue(vdWtype, "vdWtype",
                                            "Lennard-Jones");
    DefineOptionalParameterWithDefaultValue(DistanceMixingRule,
                                            "DistanceMixingRule", "arithmetic");
    DefineOptionalParameterWithDefaultValue(DistanceType, "DistanceType",
                                            "sigma");
    DefineOptionalParameterWithDefaultValue(EnergyMixingRule,
                                            "EnergyMixingRule", "geometric");
    DefineOptionalParameterWithDefaultValue(EnergyUnitScaling,
                                            "EnergyUnitScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(MetallicEnergyUnitScaling,
                                            "MetallicEnergyUnitScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(
        FluctuatingChargeEnergyUnitScaling,
        "FluctuatingChargeEnergyUnitScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(DistanceUnitScaling,
                                            "DistanceUnitScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(AngleUnitScaling,
                                            "AngleUnitScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(ChargeUnitScaling,
                                            "ChargeUnitScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(OxidationStateScaling,
                                            "OxidationStateScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(
        TorsionAngleConvention, "TorsionAngleConvention", "180_is_trans");
    DefineOptionalParameter(vdw12scale, "vdW-12-scale");
    DefineOptionalParameter(vdw13scale, "vdW-13-scale");
    DefineOptionalParameter(vdw14scale, "vdW-14-scale");
    DefineOptionalParameter(electrostatic12scale, "electrostatic-12-scale");
    DefineOptionalParameter(electrostatic13scale, "electrostatic-13-scale");
    DefineOptionalParameter(electrostatic14scale, "electrostatic-14-scale");
    DefineOptionalParameterWithDefaultValue(BondForceConstantScaling,
                                            "BondForceConstantScaling", 1.0);
    DefineOptionalParameterWithDefaultValue(BendForceConstantScaling,
                                            "BendForceConstantScaling", 1.0);

    // DefineOptionalParameterWithDefaultValue(vdw12scale, "vdW-12-scale", 0.0);
    // DefineOptionalParameterWithDefaultValue(vdw13scale, "vdW-13-scale", 0.0);
    // DefineOptionalParameterWithDefaultValue(vdw14scale, "vdW-14-scale", 0.0);
    // DefineOptionalParameterWithDefaultValue(electrostatic12scale,
    // "electrostatic-12-scale", 0.0);
    // DefineOptionalParameterWithDefaultValue(electrostatic13scale,
    // "electrostatic-13-scale", 0.0);
    // DefineOptionalParameterWithDefaultValue(electrostatic14scale,
    // "electrostatic-14-scale", 0.0);
    DefineOptionalParameterWithDefaultValue(GayBerneMu, "GayBerneMu", 2.0);
    DefineOptionalParameterWithDefaultValue(GayBerneNu, "GayBerneNu", 1.0);
    DefineOptionalParameterWithDefaultValue(EAMMixingMethod, "EAMMixingMethod",
                                            "Johnson");
    DefineOptionalParameterWithDefaultValue(
        DelayedParameterCalculation, "delayedParameterCalculation", false);

    deprecatedKeywords_.insert("cutoffPolicy");
  }